

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

SrcList * sqlite3SrcListEnlarge(sqlite3 *db,SrcList *pSrc,int nExtra,int iStart)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  SrcList *pSVar5;
  SrcList_item *pSVar6;
  long lVar7;
  Select **ppSVar8;
  u64 n;
  SrcList_item *pSVar9;
  ulong uVar10;
  SrcList_item *pSVar11;
  SrcList_item *pSVar12;
  long lVar13;
  SrcList *pSVar14;
  long lVar15;
  byte bVar16;
  int iVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  int iVar21;
  undefined1 auVar20 [16];
  
  bVar16 = 0;
  pSVar14 = pSrc;
  if (pSrc->nAlloc < (uint)(pSrc->nSrc + nExtra)) {
    n = (long)(nExtra + pSrc->nSrc * 2 + -1) * 0x70 + 0x78;
    if (((pSrc < (SrcList *)(db->lookaside).pStart) || ((SrcList *)(db->lookaside).pEnd <= pSrc)) ||
       (pSVar5 = pSrc, (db->lookaside).sz < n)) {
      pSVar5 = (SrcList *)dbReallocFinish(db,pSrc,n);
    }
    if (pSVar5 != (SrcList *)0x0) {
      if (((db == (sqlite3 *)0x0) || (pSVar5 < (SrcList *)(db->lookaside).pStart)) ||
         ((SrcList *)(db->lookaside).pEnd <= pSVar5)) {
        uVar4 = (*sqlite3Config.m.xSize)(pSVar5);
      }
      else {
        uVar4 = (uint)(db->lookaside).sz;
      }
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)(int)uVar4 - 0x78U >> 4;
      pSVar5->nAlloc = SUB164(auVar1 * ZEXT816(0x2492492492492493),8) + 1;
      pSVar14 = pSVar5;
    }
    if (pSVar5 == (SrcList *)0x0) {
      return pSrc;
    }
  }
  lVar13 = (long)pSVar14->nSrc;
  lVar15 = (long)iStart;
  if (iStart < pSVar14->nSrc) {
    pSVar6 = pSVar14->a + lVar13 + -1;
    pSVar9 = pSVar14->a + nExtra + lVar13 + -1;
    do {
      lVar13 = lVar13 + -1;
      pSVar11 = pSVar6;
      pSVar12 = pSVar9;
      for (lVar7 = 0xe; lVar7 != 0; lVar7 = lVar7 + -1) {
        pSVar12->pSchema = pSVar11->pSchema;
        pSVar11 = (SrcList_item *)((long)pSVar11 + ((ulong)bVar16 * -2 + 1) * 8);
        pSVar12 = (SrcList_item *)((long)pSVar12 + ((ulong)bVar16 * -2 + 1) * 8);
      }
      pSVar6 = pSVar6 + -1;
      pSVar9 = pSVar9 + -1;
    } while (lVar15 < lVar13);
  }
  pSVar14->nSrc = pSVar14->nSrc + nExtra;
  memset(pSVar14->a + lVar15,0,(ulong)(uint)nExtra * 0x70);
  auVar3 = _DAT_001960a0;
  auVar2 = _DAT_00196090;
  auVar1 = _DAT_00196080;
  if (0 < nExtra) {
    lVar13 = (long)(nExtra + iStart);
    if ((long)(nExtra + iStart) < lVar15 + 1) {
      lVar13 = lVar15 + 1;
    }
    lVar7 = (lVar13 - lVar15) + -1;
    auVar17._8_4_ = (int)lVar7;
    auVar17._0_8_ = lVar7;
    auVar17._12_4_ = (int)((ulong)lVar7 >> 0x20);
    ppSVar8 = &pSVar14[3].a[lVar15].pSelect;
    uVar10 = 0;
    auVar17 = auVar17 ^ _DAT_001960a0;
    do {
      auVar19._8_4_ = (int)uVar10;
      auVar19._0_8_ = uVar10;
      auVar19._12_4_ = (int)(uVar10 >> 0x20);
      auVar20 = (auVar19 | auVar2) ^ auVar3;
      iVar18 = auVar17._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar18 && auVar17._0_4_ < auVar20._0_4_ ||
                  iVar18 < auVar20._4_4_) & 1)) {
        *(undefined4 *)(ppSVar8 + -0x2a) = 0xffffffff;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        *(undefined4 *)(ppSVar8 + -0x1c) = 0xffffffff;
      }
      auVar19 = (auVar19 | auVar1) ^ auVar3;
      iVar21 = auVar19._4_4_;
      if (iVar21 <= iVar18 && (iVar21 != iVar18 || auVar19._0_4_ <= auVar17._0_4_)) {
        *(undefined4 *)(ppSVar8 + -0xe) = 0xffffffff;
        *(undefined4 *)ppSVar8 = 0xffffffff;
      }
      uVar10 = uVar10 + 4;
      ppSVar8 = ppSVar8 + 0x38;
    } while (((lVar13 - lVar15) + 3U & 0xfffffffffffffffc) != uVar10);
  }
  return pSVar14;
}

Assistant:

SQLITE_PRIVATE SrcList *sqlite3SrcListEnlarge(
  sqlite3 *db,       /* Database connection to notify of OOM errors */
  SrcList *pSrc,     /* The SrcList to be enlarged */
  int nExtra,        /* Number of new slots to add to pSrc->a[] */
  int iStart         /* Index in pSrc->a[] of first new slot */
){
  int i;

  /* Sanity checking on calling parameters */
  assert( iStart>=0 );
  assert( nExtra>=1 );
  assert( pSrc!=0 );
  assert( iStart<=pSrc->nSrc );

  /* Allocate additional space if needed */
  if( (u32)pSrc->nSrc+nExtra>pSrc->nAlloc ){
    SrcList *pNew;
    int nAlloc = pSrc->nSrc*2+nExtra;
    int nGot;
    pNew = sqlite3DbRealloc(db, pSrc,
               sizeof(*pSrc) + (nAlloc-1)*sizeof(pSrc->a[0]) );
    if( pNew==0 ){
      assert( db->mallocFailed );
      return pSrc;
    }
    pSrc = pNew;
    nGot = (sqlite3DbMallocSize(db, pNew) - sizeof(*pSrc))/sizeof(pSrc->a[0])+1;
    pSrc->nAlloc = nGot;
  }

  /* Move existing slots that come after the newly inserted slots
  ** out of the way */
  for(i=pSrc->nSrc-1; i>=iStart; i--){
    pSrc->a[i+nExtra] = pSrc->a[i];
  }
  pSrc->nSrc += nExtra;

  /* Zero the newly allocated slots */
  memset(&pSrc->a[iStart], 0, sizeof(pSrc->a[0])*nExtra);
  for(i=iStart; i<iStart+nExtra; i++){
    pSrc->a[i].iCursor = -1;
  }

  /* Return a pointer to the enlarged SrcList */
  return pSrc;
}